

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  size_type sVar9;
  bool bVar10;
  
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_00138bf0;
  this->pos_ = 0;
  this->fd_ = fd;
  uVar6 = std::__cxx11::string::rfind((char)filename,0x2f);
  if (uVar6 == 0xffffffffffffffff) {
    plVar8 = (long *)(filename->_M_dataplus)._M_p;
    sVar9 = filename->_M_string_length;
  }
  else {
    lVar7 = std::__cxx11::string::find((char)filename,0x2f);
    if (lVar7 != -1) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                    ,0x1a2,
                    "static Slice leveldb::(anonymous namespace)::PosixWritableFile::Basename(const std::string &)"
                   );
    }
    plVar8 = (long *)((filename->_M_dataplus)._M_p + uVar6 + 1);
    sVar9 = ~uVar6 + filename->_M_string_length;
  }
  if (sVar9 < 8) {
    bVar10 = false;
  }
  else {
    bVar10 = *plVar8 == 0x54534546494e414d;
  }
  this->is_manifest_ = bVar10;
  psVar2 = &this->filename_;
  paVar3 = &(this->filename_).field_2;
  (this->filename_)._M_dataplus._M_p = (pointer)paVar3;
  pcVar4 = (filename->_M_dataplus)._M_p;
  paVar1 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&filename->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->filename_).field_2 + 8) = uVar5;
  }
  else {
    (psVar2->_M_dataplus)._M_p = pcVar4;
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->filename_)._M_string_length = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar1;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  lVar7 = std::__cxx11::string::rfind((char)psVar2,0x2f);
  if (lVar7 == -1) {
    (this->dirname_)._M_dataplus._M_p = (pointer)&(this->dirname_).field_2;
    *(undefined2 *)&(this->dirname_).field_2 = 0x2e;
    (this->dirname_)._M_string_length = 1;
  }
  else {
    lVar7 = std::__cxx11::string::find((char)psVar2,0x2f);
    if (lVar7 != -1) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix.cc"
                    ,0x192,
                    "static std::string leveldb::(anonymous namespace)::PosixWritableFile::Dirname(const std::string &)"
                   );
    }
    std::__cxx11::string::substr((ulong)&this->dirname_,(ulong)psVar2);
  }
  return;
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}